

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

bool __thiscall
gl4cts::GPUShaderFP64Test2::test
          (GPUShaderFP64Test2 *this,shaderStage shader_stage,uniformTypeDetails *uniform_type)

{
  bool bVar1;
  GLuint program_id;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  size_t sVar6;
  undefined4 uVar7;
  char *pcVar8;
  undefined4 uVar9;
  programInfo program_info;
  programInfo local_1d8;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  long lVar5;
  
  uVar7 = 0;
  if (shader_stage - FRAGMENT_SHADER < 5) {
    uVar7 = *(undefined4 *)(&DAT_01a7fb84 + (ulong)(shader_stage - FRAGMENT_SHADER) * 4);
  }
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  uVar9 = 0x400;
  if (shader_stage == FRAGMENT_SHADER) {
    uVar9 = 4;
  }
  local_1d8.m_context = (this->super_TestCase).m_context;
  local_1d8.m_compute_shader_id = 0;
  local_1d8.m_fragment_shader_id = 0;
  local_1d8.m_geometry_shader_id = 0;
  local_1d8.m_program_object_id = 0;
  local_1d8.m_tesselation_control_shader_id = 0;
  local_1d8.m_tesselation_evaluation_shader_id = 0;
  local_1d8.m_vertex_shader_id = 0;
  prepareProgram(this,shader_stage,uniform_type,&local_1d8);
  program_id = local_1d8.m_program_object_id;
  (**(code **)(lVar5 + 0x1680))(local_1d8.m_program_object_id);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"UseProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x10bf);
  prepareUniforms(this,shader_stage,uniform_type,&local_1d8);
  testBegin(this,program_id,shader_stage);
  if (shader_stage == COMPUTE_SHADER) {
    (*this->m_pDispatchCompute)(0x20,0x20,1);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    iVar3 = 0x10cb;
    pcVar8 = "DispatchCompute";
  }
  else {
    (**(code **)(lVar5 + 0x538))(uVar7,0,uVar9);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    iVar3 = 0x10d0;
    pcVar8 = "DrawArrays";
  }
  glu::checkError(dVar4,pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,iVar3);
  testEnd(this,shader_stage);
  bVar2 = verifyResults(this,shader_stage);
  if (bVar2) goto LAB_0092db62;
  local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Shader stage: ",0xe);
  switch(shader_stage) {
  case COMPUTE_SHADER:
    pcVar8 = "compute shader";
    break;
  case FRAGMENT_SHADER:
    pcVar8 = "fragment shader";
    break;
  case GEOMETRY_SHADER:
    pcVar8 = "geometry shader";
    break;
  case TESS_CTRL_SHADER:
    pcVar8 = "tesselation control shader";
    break;
  case TESS_EVAL_SHADER:
    pcVar8 = "tesselation evaluation shader";
    break;
  case VERTEX_SHADER:
    pcVar8 = "vertex shader";
    break;
  default:
    bVar1 = true;
    pcVar8 = (char *)0x0;
    goto LAB_0092dadc;
  }
  bVar1 = false;
LAB_0092dadc:
  if (bVar1) {
    std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-3]);
  }
  else {
    sVar6 = strlen(pcVar8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar8,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,". Uniform type: ",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,(uniform_type->m_type_name)._M_dataplus._M_p,
             (uniform_type->m_type_name)._M_string_length);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
LAB_0092db62:
  Utils::programInfo::~programInfo(&local_1d8);
  return bVar2;
}

Assistant:

bool GPUShaderFP64Test2::test(shaderStage shader_stage, const uniformTypeDetails& uniform_type) const
{
	const glw::GLenum		draw_primitive = getDrawPrimitiveType(shader_stage);
	static const glw::GLint first_vertex   = 0;
	const glw::Functions&   gl			   = m_context.getRenderContext().getFunctions();
	const glw::GLsizei		n_vertices	 = (FRAGMENT_SHADER == shader_stage) ? 4 : m_n_captured_results;
	Utils::programInfo		program_info(m_context);
	bool					result = true;

	/* Prepare program */
	prepareProgram(shader_stage, uniform_type, program_info);

	gl.useProgram(program_info.m_program_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgram");

	/* Prepare uniform buffer and bind it with uniform block */
	prepareUniforms(shader_stage, uniform_type, program_info);

	/* Prepare storage for test results */
	testBegin(program_info.m_program_object_id, shader_stage);

	/* Execute */
	if (COMPUTE_SHADER == shader_stage)
	{
		m_pDispatchCompute(m_texture_width, m_texture_height, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DispatchCompute");
	}
	else
	{
		gl.drawArrays(draw_primitive, first_vertex, n_vertices);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");
	}

	/* Clean after test */
	testEnd(shader_stage);

	/* Check results */
	if (false == verifyResults(shader_stage))
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Shader stage: " << getShaderStageName(shader_stage)
			<< ". Uniform type: " << uniform_type.m_type_name << tcu::TestLog::EndMessage;

		result = false;
	}

	return result;
}